

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_dup_common(lyd_node *parent,lyd_node *new,lyd_node *orig,ly_ctx *ctx)

{
  byte bVar1;
  uint16_t uVar2;
  lys_node *plVar3;
  lyd_attr *plVar4;
  byte bVar5;
  int iVar6;
  lys_module *plVar7;
  size_t sVar8;
  lys_node *plVar9;
  lyd_attr *plVar10;
  lyd_attr *plVar11;
  char *pcVar12;
  lyd_val lVar13;
  undefined8 *puVar14;
  LY_ERR *pLVar15;
  ly_ctx *ctx_00;
  lyd_attr **pplVar16;
  int local_34;
  
  if (ctx == (ly_ctx *)0x0) {
    new->schema = orig->schema;
LAB_0015bb94:
    new->attr = (lyd_attr *)0x0;
    local_34 = 1;
    pplVar16 = &orig->attr;
    while (plVar4 = *pplVar16, plVar4 != (lyd_attr *)0x0) {
      ctx_00 = ctx;
      if (ctx == (ly_ctx *)0x0) {
        ctx_00 = orig->schema->module->ctx;
      }
      plVar11 = new->attr;
      if (new->attr == (lyd_attr *)0x0) {
        plVar11 = (lyd_attr *)malloc(0x38);
        new->attr = plVar11;
      }
      else {
        do {
          plVar10 = plVar11;
          plVar11 = plVar10->next;
        } while (plVar11 != (lyd_attr *)0x0);
        plVar11 = (lyd_attr *)calloc(1,0x38);
        plVar10->next = plVar11;
      }
      if (plVar11 == (lyd_attr *)0x0) {
        pLVar15 = ly_errno_location();
        *pLVar15 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_dup_attr");
        goto LAB_0015bcd1;
      }
      plVar11->parent = new;
      plVar11->next = (lyd_attr *)0x0;
      plVar11->annotation = plVar4->annotation;
      pcVar12 = lydict_insert(ctx_00,plVar4->name,0);
      plVar11->name = pcVar12;
      lVar13.binary = lydict_insert(ctx_00,plVar4->value_str,0);
      plVar11->value_str = (char *)lVar13;
      uVar2 = plVar4->value_type;
      plVar11->value_type = uVar2;
      switch(uVar2) {
      case 1:
      case 10:
        break;
      case 2:
      case 6:
      case 7:
        puVar14 = (undefined8 *)
                  lys_ext_complex_get_substmt
                            (LY_STMT_TYPE,plVar11->annotation,(lyext_substmt **)0x0);
        lyp_parse_value((lys_type *)*puVar14,&plVar11->value_str,(lyxml_elem *)0x0,
                        (lyd_node_leaf_list *)0x0,plVar11,1,0);
        goto LAB_0015bcd1;
      default:
        lVar13 = plVar4->value;
        break;
      case 8:
      case 9:
        (plVar11->value).binary = (char *)0x0;
        goto LAB_0015bcd1;
      case 0xb:
        lVar13.binary = lydict_insert(ctx_00,(plVar4->value).binary,0);
      }
      (plVar11->value).binary = (char *)lVar13;
LAB_0015bcd1:
      pplVar16 = &plVar4->next;
    }
    new->next = (lyd_node *)0x0;
    new->prev = new;
    new->parent = (lyd_node *)0x0;
    iVar6 = ly_new_node_validity(new->schema);
    new->validity = (uint8_t)iVar6;
    bVar5 = orig->field_0x9 & 1;
    bVar1 = new->field_0x9;
    new->field_0x9 = bVar1 & 0xfe | bVar5;
    new->field_0x9 = bVar1 & 0xf0 | bVar5 | orig->field_0x9 & 8;
    if ((parent == (lyd_node *)0x0) || (iVar6 = lyd_insert(parent,new), iVar6 == 0)) {
      local_34 = 0;
    }
  }
  else {
    if (parent == (lyd_node *)0x0) {
      plVar9 = lyd_get_schema_inctx(orig,ctx);
      new->schema = plVar9;
LAB_0015bb8b:
      if (plVar9 != (lys_node *)0x0) goto LAB_0015bb94;
      pLVar15 = ly_errno_location();
      *pLVar15 = LY_EINVAL;
      ly_log(LY_LLERR,
             "Target context does not contain schema node for the data node being duplicated (%s:%s)."
             ,orig->schema->module->name,orig->schema->name);
    }
    else {
      plVar7 = lys_node_module(parent->schema);
      pcVar12 = orig->schema->module->name;
      sVar8 = strlen(pcVar12);
      plVar7 = lys_get_import_module(plVar7,(char *)0x0,0,pcVar12,(int)sVar8);
      if (plVar7 != (lys_module *)0x0) {
        plVar9 = parent->schema->child;
        plVar3 = orig->schema;
        pcVar12 = plVar3->name;
        sVar8 = strlen(pcVar12);
        lys_get_data_sibling(plVar7,plVar9,pcVar12,(int)sVar8,plVar3->nodetype,&new->schema);
        plVar9 = new->schema;
        goto LAB_0015bb8b;
      }
      pLVar15 = ly_errno_location();
      *pLVar15 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
             ,0x1178);
    }
    local_34 = 1;
  }
  return local_34;
}

Assistant:

static int
lyd_dup_common(struct lyd_node *parent, struct lyd_node *new, const struct lyd_node *orig, struct ly_ctx *ctx)
{
    struct lyd_attr *attr;
    const struct lys_module *trg_mod;

    /* fill common part */
    if (ctx) {
        /* we are changing the context, so we have to get the correct schema node in the new context */
        if (parent) {
            trg_mod = lys_get_import_module(lys_node_module(parent->schema), NULL, 0, orig->schema->module->name,
                                            strlen(orig->schema->module->name));
            if (!trg_mod) {
                LOGINT;
                return EXIT_FAILURE;
            }
            /* we know its parent, so we can start with it */
            lys_get_data_sibling(trg_mod, parent->schema->child, orig->schema->name, strlen(orig->schema->name),
                                 orig->schema->nodetype, (const struct lys_node **)&new->schema);
        } else {
            /* we have to search in complete context */
            new->schema = lyd_get_schema_inctx(orig, ctx);
        }

        if (!new->schema) {
            LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being duplicated "
                   "(%s:%s).", orig->schema->module->name, orig->schema->name);
            return EXIT_FAILURE;
        }
    } else {
        /* the context is the same so also the pointer into the schema will be the same */
        new->schema = orig->schema;
    }
    new->attr = NULL;
    LY_TREE_FOR(orig->attr, attr) {
        lyd_dup_attr(ctx ? ctx : orig->schema->module->ctx, new, attr);
    }
    new->next = NULL;
    new->prev = new;
    new->parent = NULL;
    new->validity = ly_new_node_validity(new->schema);
    new->dflt = orig->dflt;
    new->when_status = orig->when_status & LYD_WHEN;

    if (parent && lyd_insert(parent, new)) {
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}